

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler *pResampler,float *pFrameOut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = pResampler->inTimeFrac;
  uVar2 = (pResampler->config).sampleRateOut;
  uVar3 = (pResampler->config).channels;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pFrameOut[uVar4] =
         ((pResampler->x1).f32[uVar4] - (pResampler->x0).f32[uVar4]) * ((float)uVar1 / (float)uVar2)
         + (pResampler->x0).f32[uVar4];
  }
  return;
}

Assistant:

static void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler* pResampler, float* MA_RESTRICT pFrameOut)
{
    ma_uint32 c;
    float a;
    const ma_uint32 channels = pResampler->config.channels;

    MA_ASSERT(pResampler != NULL);
    MA_ASSERT(pFrameOut  != NULL);

    a = (float)pResampler->inTimeFrac / pResampler->config.sampleRateOut;

    MA_ASSUME(channels > 0);
    for (c = 0; c < channels; c += 1) {
        float s = ma_mix_f32_fast(pResampler->x0.f32[c], pResampler->x1.f32[c], a);
        pFrameOut[c] = s;
    }
}